

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualRedCostViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  uint *puVar1;
  pointer pnVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)maxviol,0.0);
  local_70 = &sumviol->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)sumviol,0.0);
  iVar3 = (this->thecovectors->set).thenum;
  if (this->theType == ENTER) {
    if (0 < iVar3) {
      lVar4 = 0x30;
      lVar5 = 0;
      do {
        pnVar2 = (this->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_a8.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar4 + -0x10);
        puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x30);
        local_a8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x20);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar4 + -8);
        local_a8.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar4 + -4);
        local_a8._48_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar4);
        if (local_a8.fpclass != cpp_dec_float_NaN) {
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
          iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_a8,&local_68);
          if (iVar3 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (local_70,&local_a8);
            if (((local_a8.fpclass != cpp_dec_float_NaN) &&
                ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
               (iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_a8,&maxviol->m_backend), iVar3 < 0)) {
              *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) =
                   local_a8.data._M_elems._32_8_;
              *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) =
                   local_a8.data._M_elems._16_8_;
              *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) =
                   local_a8.data._M_elems._24_8_;
              *(undefined8 *)(maxviol->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
              *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_a8.data._M_elems._8_8_
              ;
              (maxviol->m_backend).exp = local_a8.exp;
              (maxviol->m_backend).neg = local_a8.neg;
              (maxviol->m_backend).fpclass = local_a8.fpclass;
              (maxviol->m_backend).prec_elem = local_a8.prec_elem;
            }
          }
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x38;
      } while (lVar5 < (this->thecovectors->set).thenum);
    }
    if (0 < (this->thevectors->set).thenum) {
      lVar4 = 0x30;
      lVar5 = 0;
      do {
        pnVar2 = (this->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_a8.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar4 + -0x10);
        puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x30);
        local_a8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x20);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar4 + -8);
        local_a8.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar4 + -4);
        local_a8._48_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar4);
        if (local_a8.fpclass != cpp_dec_float_NaN) {
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
          iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_a8,&local_68);
          if (iVar3 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (local_70,&local_a8);
            if (((local_a8.fpclass != cpp_dec_float_NaN) &&
                ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
               (iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_a8,&maxviol->m_backend), iVar3 < 0)) {
              *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) =
                   local_a8.data._M_elems._32_8_;
              *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) =
                   local_a8.data._M_elems._16_8_;
              *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) =
                   local_a8.data._M_elems._24_8_;
              *(undefined8 *)(maxviol->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
              *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_a8.data._M_elems._8_8_
              ;
              (maxviol->m_backend).exp = local_a8.exp;
              (maxviol->m_backend).neg = local_a8.neg;
              (maxviol->m_backend).fpclass = local_a8.fpclass;
              (maxviol->m_backend).prec_elem = local_a8.prec_elem;
            }
          }
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x38;
      } while (lVar5 < (this->thevectors->set).thenum);
    }
  }
  else if (0 < iVar3) {
    lVar4 = 0x30;
    lVar5 = 0;
    do {
      pnVar2 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar4 + -0x10);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x30);
      local_a8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x20);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_a8.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar4 + -8);
      local_a8.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar4 + -4);
      local_a8._48_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar4);
      if (local_a8.fpclass != cpp_dec_float_NaN) {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
        iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_a8,&local_68);
        if (iVar3 < 0) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (local_70,&local_a8);
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_a8,&maxviol->m_backend), iVar3 < 0)) {
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_a8.data._M_elems._32_8_;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_a8.data._M_elems._16_8_;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_a8.data._M_elems._24_8_;
            *(undefined8 *)(maxviol->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_a8.data._M_elems._8_8_;
            (maxviol->m_backend).exp = local_a8.exp;
            (maxviol->m_backend).neg = local_a8.neg;
            (maxviol->m_backend).fpclass = local_a8.fpclass;
            (maxviol->m_backend).prec_elem = local_a8.prec_elem;
          }
        }
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar5 < (this->thecovectors->set).thenum);
  }
  local_68.data._M_elems[0] = 0xffffffff;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
  ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                *)maxviol,(int *)&local_68);
  return;
}

Assistant:

void SPxSolverBase<R>::qualRedCostViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   int i;

   // TODO:   y = c_B * B^-1  => coSolve(y, c_B)
   //         redcost = c_N - yA_N
   // solve system "x = e_i^T * B^-1" to get i'th row of B^-1
   // VectorBase<R> y( this->nRows() );
   // basis().coSolve( x, spx->unitVector( i ) );
   // VectorBase<R> rdcost( this->nCols() );
   if(type() == ENTER)
   {
      for(i = 0; i < dim(); ++i)
      {
         R x = coTest()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }

      for(i = 0; i < coDim(); ++i)
      {
         R x = test()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }
   }
   else
   {
      assert(type() == LEAVE);

      for(i = 0; i < dim(); ++i)
      {
         R x = fTest()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }
   }

   maxviol *= -1;
}